

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O0

size_t __thiscall
sentencepiece::SentencePieceText_SentencePiece::ByteSizeLong(SentencePieceText_SentencePiece *this)

{
  uint uVar1;
  uint32 uVar2;
  int size;
  string *psVar3;
  size_t sVar4;
  InternalMetadata *this_00;
  long lVar5;
  int cached_size;
  uint32 cached_has_bits;
  size_t total_size;
  SentencePieceText_SentencePiece *this_local;
  
  _cached_size = google::protobuf::internal::ExtensionSet::ByteSize(&this->_extensions_);
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x1f) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar3 = _internal_piece_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar3);
      _cached_size = sVar4 + 1 + _cached_size;
    }
    if ((uVar1 & 2) != 0) {
      psVar3 = _internal_surface_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar3);
      _cached_size = sVar4 + 1 + _cached_size;
    }
    if ((uVar1 & 4) != 0) {
      uVar2 = _internal_id(this);
      sVar4 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
      _cached_size = sVar4 + 1 + _cached_size;
    }
    if ((uVar1 & 8) != 0) {
      uVar2 = _internal_begin(this);
      sVar4 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
      _cached_size = sVar4 + 1 + _cached_size;
    }
    if ((uVar1 & 0x10) != 0) {
      uVar2 = _internal_end(this);
      sVar4 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
      _cached_size = sVar4 + 1 + _cached_size;
    }
  }
  if (((uint)(this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 1) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    if (((uint)this_00->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (this_00);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    lVar5 = std::__cxx11::string::size();
    _cached_size = lVar5 + _cached_size;
  }
  size = google::protobuf::internal::ToCachedSize(_cached_size);
  SetCachedSize(this,size);
  return _cached_size;
}

Assistant:

size_t SentencePieceText_SentencePiece::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:sentencepiece.SentencePieceText.SentencePiece)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000001fu) {
    // optional string piece = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_piece());
    }

    // optional string surface = 3;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_surface());
    }

    // optional uint32 id = 2;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt32Size(
          this->_internal_id());
    }

    // optional uint32 begin = 4;
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt32Size(
          this->_internal_begin());
    }

    // optional uint32 end = 5;
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt32Size(
          this->_internal_end());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}